

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

us_internal_ssl_socket_t * ssl_on_data(us_internal_ssl_socket_t *s,void *data,int length)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  us_socket_context_t *puVar5;
  us_loop_t *puVar6;
  us_internal_ssl_socket_t *puVar7;
  
  puVar5 = us_socket_context(0,&s->s);
  puVar6 = us_socket_context_loop(0,puVar5);
  puVar1 = (undefined8 *)(puVar6->data).ssl_data;
  *puVar1 = data;
  *(int *)(puVar1 + 2) = length;
  *(undefined4 *)((long)puVar1 + 0x14) = 0;
  puVar1[3] = s;
  *(undefined4 *)((long)puVar1 + 0x24) = 0;
  iVar2 = us_internal_ssl_socket_is_shut_down(s);
  if (iVar2 == 0) {
    do {
      uVar3 = 0;
      do {
        iVar2 = SSL_read((SSL *)s->ssl,(void *)(puVar1[1] + (ulong)uVar3 + 0x20),0x80000 - uVar3);
        if (iVar2 < 1) {
          uVar4 = SSL_get_error((SSL *)s->ssl,iVar2);
          if (uVar4 - 4 < 0xfffffffe) {
            if ((uVar4 & 0xfffffffb) == 1) {
              ERR_clear_error();
            }
          }
          else if (*(int *)(puVar1 + 2) == 0) {
            if (uVar3 != 0) {
              s = (us_internal_ssl_socket_t *)(*(code *)puVar5[1].prev)(s,puVar1[1] + 0x20,uVar3);
              iVar2 = us_socket_is_closed(0,(us_socket_t *)s);
              if (iVar2 != 0) {
                return s;
              }
            }
            if (s->ssl_write_wants_read != 0) {
              s->ssl_write_wants_read = 0;
              puVar5 = us_socket_context(0,&s->s);
              s = (us_internal_ssl_socket_t *)(*puVar5->on_writable)(&s->s);
              iVar2 = us_socket_is_closed(0,(us_socket_t *)s);
              if (iVar2 != 0) {
                return s;
              }
            }
            uVar3 = SSL_get_shutdown((SSL *)s->ssl);
            if ((uVar3 & 2) == 0) {
              return s;
            }
          }
          goto LAB_00105c5c;
        }
        uVar3 = uVar3 + iVar2;
      } while (uVar3 != 0x80000);
      s = (us_internal_ssl_socket_t *)(*(code *)puVar5[1].prev)(s,puVar1[1] + 0x20,0x80000);
      iVar2 = us_socket_is_closed(0,(us_socket_t *)s);
    } while (iVar2 == 0);
  }
  else {
    iVar2 = SSL_shutdown((SSL *)s->ssl);
    if (iVar2 == 1) {
LAB_00105c5c:
      puVar7 = us_internal_ssl_socket_close(s);
      return puVar7;
    }
    if ((iVar2 < 0) && (uVar3 = SSL_get_error((SSL *)s->ssl,iVar2), (uVar3 & 0xfffffffb) == 1)) {
      ERR_clear_error();
    }
  }
  return s;
}

Assistant:

struct us_internal_ssl_socket_t *ssl_on_data(struct us_internal_ssl_socket_t *s, void *data, int length) {
    // note: this context can change when we adopt the socket!
    struct us_internal_ssl_socket_context_t *context = (struct us_internal_ssl_socket_context_t *) us_socket_context(0, &s->s);

    struct us_loop_t *loop = us_socket_context_loop(0, &context->sc);
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) loop->data.ssl_data;

    // note: if we put data here we should never really clear it (not in write either, it still should be available for SSL_write to read from!)
    loop_ssl_data->ssl_read_input = data;
    loop_ssl_data->ssl_read_input_length = length;
    loop_ssl_data->ssl_read_input_offset = 0;
    loop_ssl_data->ssl_socket = &s->s;
    loop_ssl_data->msg_more = 0;

    if (us_internal_ssl_socket_is_shut_down(s)) {

        int ret;
        if ((ret = SSL_shutdown(s->ssl)) == 1) {
            // two phase shutdown is complete here
            //printf("Two step SSL shutdown complete\n");

            return us_internal_ssl_socket_close(s);
        } else if (ret < 0) {

            int err = SSL_get_error(s->ssl, ret);

            if (err == SSL_ERROR_SSL || err == SSL_ERROR_SYSCALL) {
                // we need to clear the error queue in case these added to the thread local queue
                ERR_clear_error();
            }

        }

        // no further processing of data when in shutdown state
        return s;
    }

    // bug checking: this loop needs a lot of attention and clean-ups and check-ups
    int read = 0;
    restart:
    while (1) {
        int just_read = SSL_read(s->ssl, loop_ssl_data->ssl_read_output + LIBUS_RECV_BUFFER_PADDING + read, LIBUS_RECV_BUFFER_LENGTH - read);

        if (just_read <= 0) {
            int err = SSL_get_error(s->ssl, just_read);

            // as far as I know these are the only errors we want to handle
            if (err != SSL_ERROR_WANT_READ && err != SSL_ERROR_WANT_WRITE) {

                // clear per thread error queue if it may contain something
                if (err == SSL_ERROR_SSL || err == SSL_ERROR_SYSCALL) {
                    ERR_clear_error();
                }

                // terminate connection here
                return us_internal_ssl_socket_close(s);
            } else {
                // emit the data we have and exit

                // assume we emptied the input buffer fully or error here as well!
                if (loop_ssl_data->ssl_read_input_length) {
                    return us_internal_ssl_socket_close(s);
                }

                // cannot emit zero length to app
                if (!read) {
                    break;
                }

                s = context->on_data(s, loop_ssl_data->ssl_read_output + LIBUS_RECV_BUFFER_PADDING, read);
                if (us_socket_is_closed(0, &s->s)) {
                    return s;
                }

                break;
            }

        }

        read += just_read;

        // at this point we might be full and need to emit the data to application and start over
        if (read == LIBUS_RECV_BUFFER_LENGTH) {

            // emit data and restart
            s = context->on_data(s, loop_ssl_data->ssl_read_output + LIBUS_RECV_BUFFER_PADDING, read);
            if (us_socket_is_closed(0, &s->s)) {
                return s;
            }

            read = 0;
            goto restart;
        }
    }

    // trigger writable if we failed last write with want read
    if (s->ssl_write_wants_read) {
        s->ssl_write_wants_read = 0;

        // make sure to update context before we call (context can change if the user adopts the socket!)
        context = (struct us_internal_ssl_socket_context_t *) us_socket_context(0, &s->s);

        s = (struct us_internal_ssl_socket_t *) context->sc.on_writable(&s->s); // cast here!
        // if we are closed here, then exit
        if (us_socket_is_closed(0, &s->s)) {
            return s;
        }
    }

    // check this then?
    if (SSL_get_shutdown(s->ssl) & SSL_RECEIVED_SHUTDOWN) {
        //printf("SSL_RECEIVED_SHUTDOWN\n");

        //exit(-2);

        // not correct anyways!
        s = us_internal_ssl_socket_close(s);

        //us_
    }

    return s;
}